

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

void __thiscall
dynet::FastLSTMBuilder::FastLSTMBuilder
          (FastLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<dynet::Parameter> __l;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  Model *in_R8;
  Parameter PVar1;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  Parameter p_bc;
  Parameter p_h2c;
  Parameter p_x2c;
  Parameter p_bo;
  Parameter p_c2o;
  Parameter p_h2o;
  Parameter p_x2o;
  Parameter p_bi;
  Parameter p_c2i;
  Parameter p_h2i;
  Parameter p_x2i;
  uint i;
  uint layer_input_dim;
  RNNBuilder *in_stack_fffffffffffffa30;
  Model *this_00;
  Model *in_stack_fffffffffffffa50;
  Model *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  float in_stack_fffffffffffffa64;
  Model *in_stack_fffffffffffffa68;
  Model *in_stack_fffffffffffffa70;
  Parameter local_488;
  Parameter local_478;
  Parameter local_468;
  Parameter local_458;
  Parameter local_448;
  Parameter local_438;
  Parameter local_428;
  Parameter local_418;
  Model *local_408;
  unsigned_long uStack_400;
  Model *local_3f8;
  unsigned_long uStack_3f0;
  Parameter local_3e8;
  Parameter *local_3d0;
  undefined8 local_3c8;
  undefined4 local_3a4;
  undefined4 *local_3a0;
  undefined8 local_398;
  Parameter local_368;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 *local_350;
  undefined8 local_348;
  Model *local_318;
  unsigned_long uStack_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 *local_300;
  undefined8 local_2f8;
  Model *local_2c8;
  unsigned_long uStack_2c0;
  undefined4 local_2b4;
  undefined4 *local_2b0;
  undefined8 local_2a8;
  Parameter local_278;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 *local_260;
  undefined8 local_258;
  Parameter local_228;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 *local_210;
  undefined8 local_208;
  Parameter local_1d8;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  Parameter local_188;
  undefined4 local_174;
  undefined4 *local_170;
  undefined8 local_168;
  Parameter local_138;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 *local_120;
  undefined8 local_118;
  Parameter local_e8;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 *local_d0;
  undefined8 local_c8;
  Parameter local_98;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 *local_70;
  undefined8 local_68;
  Parameter local_38;
  uint local_28;
  undefined4 local_24;
  Model *local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder(in_stack_fffffffffffffa30);
  *in_RDI = &PTR__FastLSTMBuilder_00efa2b0;
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            *)0x9a9a98);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
            *)0x9a9ab1);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
            *)0x9a9aca);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
            *)0x9a9ae3);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x9a9aff);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x9a9b1b);
  *(uint *)(in_RDI + 0x19) = local_c;
  local_24 = local_10;
  for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
    local_78 = local_14;
    local_74 = local_24;
    local_70 = &local_78;
    local_68 = 2;
    x._M_len._0_4_ = in_stack_fffffffffffffa60;
    x._M_array = (iterator)in_stack_fffffffffffffa58;
    x._M_len._4_4_ = in_stack_fffffffffffffa64;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_d8 = local_14;
    local_d4 = local_14;
    local_d0 = &local_d8;
    local_c8 = 2;
    x_00._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_00._M_array = (iterator)in_stack_fffffffffffffa58;
    x_00._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_38 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_00);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_128 = local_14;
    local_124 = 1;
    local_120 = &local_128;
    local_118 = 2;
    x_01._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_01._M_array = (iterator)in_stack_fffffffffffffa58;
    x_01._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_98 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_01);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_174 = local_14;
    local_170 = &local_174;
    local_168 = 1;
    x_02._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_02._M_array = (iterator)in_stack_fffffffffffffa58;
    x_02._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_e8 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_02);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_1c8 = local_14;
    local_1c4 = local_24;
    local_1c0 = &local_1c8;
    local_1b8 = 2;
    x_03._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_03._M_array = (iterator)in_stack_fffffffffffffa58;
    x_03._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_138 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_03);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_218 = local_14;
    local_214 = local_14;
    local_210 = &local_218;
    local_208 = 2;
    x_04._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_04._M_array = (iterator)in_stack_fffffffffffffa58;
    x_04._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_188 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_04);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_268 = local_14;
    local_264 = 1;
    local_260 = &local_268;
    local_258 = 2;
    x_05._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_05._M_array = (iterator)in_stack_fffffffffffffa58;
    x_05._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_1d8 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_05);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_2b4 = local_14;
    local_2b0 = &local_2b4;
    local_2a8 = 1;
    x_06._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_06._M_array = (iterator)in_stack_fffffffffffffa58;
    x_06._M_len._4_4_ = in_stack_fffffffffffffa64;
    local_228 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_06);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_308 = local_14;
    local_304 = local_24;
    local_300 = &local_308;
    local_2f8 = 2;
    x_07._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_07._M_array = (iterator)in_stack_fffffffffffffa58;
    x_07._M_len._4_4_ = in_stack_fffffffffffffa64;
    in_stack_fffffffffffffa70 = local_20;
    local_278 = PVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_07);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    uStack_2c0 = PVar1.index;
    in_stack_fffffffffffffa68 = PVar1.mp;
    in_stack_fffffffffffffa60 = (undefined4)PVar1.index;
    in_stack_fffffffffffffa64 = PVar1.index._4_4_;
    local_358 = local_14;
    local_354 = local_14;
    local_350 = &local_358;
    local_348 = 2;
    x_08._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_08._M_array = (iterator)local_20;
    x_08._M_len._4_4_ = in_stack_fffffffffffffa64;
    in_stack_fffffffffffffa58 = local_20;
    local_2c8 = in_stack_fffffffffffffa68;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_08);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    uStack_310 = PVar1.index;
    in_stack_fffffffffffffa50 = PVar1.mp;
    local_3a4 = local_14;
    local_3a0 = &local_3a4;
    local_398 = 1;
    x_09._M_len._0_4_ = in_stack_fffffffffffffa60;
    x_09._M_array = (iterator)in_stack_fffffffffffffa58;
    x_09._M_len._4_4_ = in_stack_fffffffffffffa64;
    this_00 = local_20;
    local_318 = in_stack_fffffffffffffa50;
    Dim::Dim((Dim *)in_stack_fffffffffffffa50,x_09);
    PVar1 = Model::add_parameters
                      (in_stack_fffffffffffffa70,(Dim *)in_stack_fffffffffffffa68,
                       in_stack_fffffffffffffa64);
    local_24 = local_14;
    local_408 = local_2c8;
    uStack_400 = uStack_2c0;
    local_3f8 = local_318;
    uStack_3f0 = uStack_310;
    local_3d0 = &local_488;
    local_3c8 = 0xb;
    local_3e8 = PVar1;
    local_418 = local_278;
    local_428 = local_228;
    local_438 = local_1d8;
    local_448 = local_188;
    local_458 = local_138;
    local_468 = local_e8;
    local_478 = local_98;
    local_488 = local_38;
    local_368 = PVar1;
    std::allocator<dynet::Parameter>::allocator((allocator<dynet::Parameter> *)0x9aa37a);
    __l._M_len = (size_type)in_stack_fffffffffffffa70;
    __l._M_array = (iterator)in_stack_fffffffffffffa68;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),__l,
               (allocator_type *)in_stack_fffffffffffffa58);
    std::allocator<dynet::Parameter>::~allocator((allocator<dynet::Parameter> *)0x9aa3aa);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 *)this_00,(value_type *)PVar1.mp);
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_00);
  }
  return;
}

Assistant:

FastLSTMBuilder::FastLSTMBuilder(unsigned layers,
                                 unsigned input_dim,
                                 unsigned hidden_dim,
                                 Model& model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2i = model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2i = model.add_parameters({hidden_dim, 1});
    Parameter p_bi = model.add_parameters({hidden_dim});

    // o
    Parameter p_x2o = model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2o = model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2o = model.add_parameters({hidden_dim, 1});
    Parameter p_bo = model.add_parameters({hidden_dim});

    // c
    Parameter p_x2c = model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2c = model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bc = model.add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}